

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_r4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  double local_1c8;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  double mean;
  int local_190;
  int checknull;
  int anynul;
  float nullvalue;
  float maxvalue;
  float minvalue;
  float *array;
  long ny;
  long nx;
  long ngood;
  long npix;
  long i2;
  long i1;
  long inc [9];
  long local_f8;
  long lpixel [9];
  long local_a8;
  long fpixel [9];
  int *status_local;
  imgstats *imagestats_local;
  long *naxes_local;
  int naxis_local;
  fitsfile *infptr_local;
  
  fpixel[8] = (long)status;
  memcpy(&local_a8,&DAT_0010c530,0x48);
  memcpy(&local_f8,&DAT_0010c580,0x48);
  memcpy(&i1,&DAT_0010c5d0,0x48);
  checknull = -0x7abe0eca;
  mean._4_4_ = 1;
  i2 = *naxes / 2 - (long)(XSAMPLE / 2 + -1);
  npix = *naxes / 2 + (long)(XSAMPLE / 2);
  if (i2 < 1) {
    i2 = 1;
  }
  if (*naxes < npix) {
    npix = *naxes;
  }
  local_a8 = i2;
  local_f8 = npix;
  ny = (npix - i2) + 1;
  if (1 < naxis) {
    i2 = naxes[1] / 2 - (long)(YSAMPLE / 2 + -1);
    npix = naxes[1] / 2 + (long)(YSAMPLE / 2);
    if (i2 < 1) {
      i2 = 1;
    }
    if (naxes[1] < npix) {
      npix = naxes[1];
    }
    fpixel[0] = i2;
    lpixel[0] = npix;
  }
  array = (float *)((npix - i2) + 1);
  ngood = ny * (long)array;
  if (2 < naxis) {
    fpixel[1] = naxes[2] / 2 + 1;
    lpixel[1] = naxes[2] / 2 + 1;
  }
  _maxvalue = calloc(ngood,4);
  if (_maxvalue == (void *)0x0) {
    *(undefined4 *)fpixel[8] = 0x71;
    infptr_local._4_4_ = *(int *)fpixel[8];
  }
  else {
    ffgsve(checknull,infptr,0,naxis,naxes,&local_a8,&local_f8,&i1,_maxvalue,&local_190,fpixel[8]);
    if (local_190 == 0) {
      checknull = 0;
      mean._4_4_ = 0;
    }
    fits_img_stats_float
              (checknull,_maxvalue,ny,array,mean._4_4_,&nx,&nullvalue,&anynul,&sigma,&noise1,&noise2
               ,&noise3,&noise5,&local_1c8,fpixel[8]);
    imagestats->n_nulls = (int)ngood - (int)nx;
    imagestats->minval = (double)nullvalue;
    imagestats->maxval = (double)(float)anynul;
    imagestats->mean = sigma;
    imagestats->sigma = noise1;
    imagestats->noise1 = noise2;
    imagestats->noise2 = noise3;
    imagestats->noise3 = noise5;
    imagestats->noise5 = local_1c8;
    free(_maxvalue);
    infptr_local._4_4_ = *(int *)fpixel[8];
  }
  return infptr_local._4_4_;
}

Assistant:

int fp_r4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	float *array, minvalue, maxvalue, nullvalue = FLOATNULLVALUE;
	int anynul,checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	array = calloc(npix, sizeof(float));
	if (!array) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	fits_read_subset_flt(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    nullvalue, array, &anynul, status);

	/* are there any null values in the array? */
	if (!anynul) {
	   nullvalue = 0.;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_float(array, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(array);
	return(*status);
}